

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execCmp<(moira::Instr)37,(moira::Mode)1,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  long *in_RDI;
  u32 data;
  u32 ea;
  int dst;
  int src;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uVar2;
  
  bVar1 = readOp<(moira::Mode)1,(moira::Size)4,0ul>
                    ((Moira *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     (int)((ulong)in_RDI >> 0x20),
                     (u32 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (u32 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (bVar1) {
    uVar2 = in_stack_ffffffffffffffe4;
    readD<(moira::Size)4>
              ((Moira *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
    cmp<(moira::Size)4>((Moira *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),
                        (u32)((ulong)in_RDI >> 0x20),(u32)in_RDI);
    prefetch<4ul>((Moira *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd0));
    (**(code **)(*in_RDI + 200))(in_RDI,2);
  }
  return;
}

Assistant:

void
Moira::execCmp(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;

    cmp<S>(data, readD<S>(dst));
    prefetch<POLLIPL>();

    if (S == Long) sync(2);
}